

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.hpp
# Opt level: O3

bool __thiscall
sphere<double>::is_hit
          (sphere<double> *this,ray<double> *r,double *t_min,double *t_max,hit_rec<double> *rec)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined4 uStack_54;
  undefined4 uStack_50;
  
  dVar2 = (r->o_).e[0] - (this->c_).e[0];
  dVar8 = (r->o_).e[1] - (this->c_).e[1];
  dVar5 = (r->o_).e[2] - (this->c_).e[2];
  dVar3 = (r->dir_).e[0];
  dVar10 = (r->dir_).e[1];
  dVar6 = (r->dir_).e[2];
  dVar9 = dVar6 * dVar6 + dVar3 * dVar3 + dVar10 * dVar10;
  dVar10 = dVar2 * dVar3 + dVar8 * dVar10 + dVar5 * dVar6;
  dVar3 = dVar10 * dVar10 -
          ((dVar5 * dVar5 + dVar2 * dVar2 + dVar8 * dVar8) - this->r_ * this->r_) * dVar9;
  if (dVar3 < 0.0) {
    return false;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar6 = (-dVar10 - dVar3) / dVar9;
  if ((dVar6 < *t_min) || (*t_max < dVar6)) {
    dVar6 = (dVar3 - dVar10) / dVar9;
    if (dVar6 < *t_min) {
      return false;
    }
    if (*t_max < dVar6) {
      return false;
    }
  }
  rec->t = dVar6;
  dVar3 = (r->dir_).e[2] * dVar6 + (r->o_).e[2];
  dVar2 = dVar6 * (r->dir_).e[0] + (r->o_).e[0];
  dVar6 = dVar6 * (r->dir_).e[1] + (r->o_).e[1];
  (rec->p).e[0] = dVar2;
  (rec->p).e[1] = dVar6;
  (rec->p).e[2] = dVar3;
  dVar5 = 1.0 / this->r_;
  dVar10 = (dVar3 - (this->c_).e[2]) * dVar5;
  dVar2 = dVar5 * (dVar2 - (this->c_).e[0]);
  dVar5 = dVar5 * (dVar6 - (this->c_).e[1]);
  dVar6 = (r->dir_).e[2] * dVar10 + (r->dir_).e[0] * dVar2 + dVar5 * (r->dir_).e[1];
  rec->front = dVar6 < 0.0;
  dVar3 = dVar10;
  if (0.0 <= dVar6) {
    dVar3 = -dVar10;
  }
  uVar1 = (uint)(dVar6 < 0.0);
  auVar7._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar7._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar7._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  (rec->n).e[0] = (double)(~auVar7._0_8_ & (ulong)-dVar2 | (ulong)dVar2 & auVar7._0_8_);
  (rec->n).e[1] = (double)(~auVar7._8_8_ & (ulong)-dVar5 | (ulong)dVar5 & auVar7._8_8_);
  (rec->n).e[2] = dVar3;
  (rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  uStack_54 = (undefined4)((ulong)-dVar2 >> 0x20);
  uStack_50 = SUB84(dVar5,0);
  dVar3 = acos((double)CONCAT44(uStack_54,uStack_50));
  dVar10 = atan2(-dVar10,dVar2);
  auVar4._0_8_ = dVar10 * 3.141592653589793;
  auVar4._8_8_ = dVar3;
  auVar4 = divpd(auVar4,_DAT_0010a070);
  rec->u = (double)auVar4._0_8_;
  rec->v = (double)auVar4._8_8_;
  return true;
}

Assistant:

point3<T> origin() const { return o_; }